

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void blake2s256_64(void *key,int len,uint32_t seed,void *out)

{
  hash_state *in_RCX;
  uint in_EDX;
  undefined4 in_ESI;
  hash_state *in_RDI;
  uchar buf [32];
  uchar *in_stack_00000038;
  unsigned_long in_stack_00000040;
  hash_state *in_stack_00000048;
  ulong64 local_38;
  unsigned_long in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  
  blake2s_init(in_stack_00000048,in_stack_00000040,in_stack_00000038,(unsigned_long)key);
  ltc_state.blake2s.h[0] = in_EDX ^ 0x6a09e667;
  blake2s_process(in_RCX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  blake2s_done(in_RDI,(uchar *)CONCAT44(in_ESI,in_EDX));
  (in_RCX->chc).length = local_38;
  return;
}

Assistant:

inline void blake2s256_64(const void * key, int len, uint32_t seed, void * out)
{
  // objsize
  unsigned char buf[32];
  blake2s_init(&ltc_state, 32, NULL, 0);
  ltc_state.blake2s.h[0] = 0x6A09E667UL ^ seed;
  blake2s_process(&ltc_state, (unsigned char *)key, len);
  blake2s_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}